

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O0

MPP_RET init_vid_ctx(H264dVideoCtx_t *p_Vid)

{
  h264_dpb_buf_t *phVar1;
  MppMemPool pvVar2;
  uint local_1c;
  MPP_RET ret;
  RK_U32 i;
  H264dVideoCtx_t *p_Vid_local;
  
  if (p_Vid == (H264dVideoCtx_t *)0x0) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0xae);
    }
  }
  else {
    for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
      phVar1 = (h264_dpb_buf_t *)mpp_osal_calloc("init_vid_ctx",0x68);
      p_Vid->p_Dpb_layer[local_1c] = phVar1;
      if (p_Vid->p_Dpb_layer[local_1c] == (h264_dpb_buf_t *)0x0) {
        if ((h264d_debug & 1) != 0) {
          _mpp_log_l(4,"h264d_api","malloc buffer error(%d).\n",(char *)0x0,0xb2);
        }
        free_vid_ctx(p_Vid);
        return MPP_ERR_MALLOC;
      }
      p_Vid->p_Dpb_layer[local_1c]->layer_id = local_1c;
      p_Vid->p_Dpb_layer[local_1c]->p_Vid = p_Vid;
      p_Vid->p_Dpb_layer[local_1c]->init_done = 0;
      p_Vid->p_Dpb_layer[local_1c]->poc_interval = 2;
    }
    p_Vid->active_sps = (h264_sps_t *)0x0;
    p_Vid->active_subsps = (h264_subsps_t *)0x0;
    p_Vid->active_sps_id[0] = 0xffffffff;
    p_Vid->active_sps_id[1] = 0xffffffff;
    pvVar2 = mpp_mem_pool_init_f("init_vid_ctx",0xe0);
    p_Vid->pic_st = pvVar2;
  }
  return MPP_OK;
}

Assistant:

static MPP_RET init_vid_ctx(H264dVideoCtx_t *p_Vid)
{
    RK_U32 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;

    INP_CHECK(ret, !p_Vid);

    for (i = 0; i < MAX_NUM_DPB_LAYERS; i++) {
        p_Vid->p_Dpb_layer[i] = mpp_calloc(H264_DpbBuf_t, 1);
        MEM_CHECK(ret, p_Vid->p_Dpb_layer[i]);
        p_Vid->p_Dpb_layer[i]->layer_id  = i;
        p_Vid->p_Dpb_layer[i]->p_Vid     = p_Vid;
        p_Vid->p_Dpb_layer[i]->init_done = 0;
        p_Vid->p_Dpb_layer[i]->poc_interval = 2;
    }

    //!< init active_sps
    p_Vid->active_sps       = NULL;
    p_Vid->active_subsps    = NULL;
    p_Vid->active_sps_id[0] = -1;
    p_Vid->active_sps_id[1] = -1;
    p_Vid->pic_st = mpp_mem_pool_init(sizeof(H264_StorePic_t));
__RETURN:
    return ret = MPP_OK;
__FAILED:
    free_vid_ctx(p_Vid);

    return ret;
}